

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

U64 Perft(int depth,game *Game)

{
  bool bVar1;
  move moveMade;
  U64 UVar2;
  U64 UVar3;
  game local_440;
  arrayMoveList moves;
  
  if (depth == 0) {
    UVar3 = 1;
  }
  else {
    game::generateLegalMoves(&moves,Game);
    arrayMoveList::resetIterator(&moves);
    UVar3 = 0;
    while( true ) {
      bVar1 = arrayMoveList::next(&moves);
      if (!bVar1) break;
      moveMade = arrayMoveList::getMove(&moves);
      game::makeMove(Game,moveMade);
      game::game(&local_440,Game);
      UVar2 = Perft(depth + -1,&local_440);
      UVar3 = UVar3 + UVar2;
      game::~game(&local_440);
      game::undoMove(Game);
    }
  }
  return UVar3;
}

Assistant:

U64 Perft(int depth, game Game)
{
    U64 nodes = 0;

    if (depth == 0) return 1;

    arrayMoveList moves = Game.generateLegalMoves();

    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      nodes += Perft(depth - 1, Game);
      Game.undoMove();
    }
    return nodes;
}